

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Spc_Emu::set_sample_rate_(Spc_Emu *this,long sample_rate)

{
  int iVar1;
  undefined4 extraout_var;
  blargg_err_t pcVar2;
  EVP_PKEY_CTX *in_RSI;
  Music_Emu *in_RDI;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  Fir_Resampler_ *in_stack_00000030;
  undefined1 in_stack_ffffffffffffffcf;
  Fir_Resampler_ *in_stack_ffffffffffffffd8;
  blargg_err_t local_8;
  
  iVar1 = Snes_Spc::init((Snes_Spc *)(in_RDI + 5),in_RSI);
  local_8 = (blargg_err_t)CONCAT44(extraout_var,iVar1);
  if (local_8 == (blargg_err_t)0x0) {
    Music_Emu::enable_accuracy(in_RDI,(bool)in_stack_ffffffffffffffcf);
    if (in_RSI != (EVP_PKEY_CTX *)0x7d00) {
      pcVar2 = Fir_Resampler_::buffer_size(in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20));
      if (pcVar2 != (blargg_err_t)0x0) {
        return pcVar2;
      }
      Fir_Resampler_::time_ratio
                (in_stack_00000030,(double)this,(double)sample_rate,(double)blargg_return_err_);
    }
    local_8 = (blargg_err_t)0x0;
  }
  return local_8;
}

Assistant:

blargg_err_t Spc_Emu::set_sample_rate_( long sample_rate )
{
	RETURN_ERR( apu.init() );
	enable_accuracy( false );
	if ( sample_rate != native_sample_rate )
	{
		RETURN_ERR( resampler.buffer_size( native_sample_rate / 20 * 2 ) );
		resampler.time_ratio( (double) native_sample_rate / sample_rate, 0.9965 );
	}
	return 0;
}